

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  global_State *pgVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  TString *pTVar6;
  int iVar7;
  TString **ppTVar8;
  uint uVar9;
  
  if (l < 0x29) {
    pgVar2 = L->l_G;
    uVar9 = pgVar2->seed ^ (uint)l;
    sVar5 = l;
    if (l != 0) {
      do {
        uVar9 = uVar9 ^ (uint)(byte)str[sVar5 - 1] + (uVar9 >> 2) + uVar9 * 0x20;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
    ppTVar8 = (pgVar2->strt).hash;
    iVar7 = (pgVar2->strt).size;
    uVar3 = iVar7 - 1U & uVar9;
    for (pTVar6 = ppTVar8[(int)uVar3]; pTVar6 != (TString *)0x0; pTVar6 = (pTVar6->u).hnext) {
      if ((pTVar6->shrlen == l) && (iVar4 = bcmp(str,pTVar6->contents,l), iVar4 == 0)) {
        if (((pgVar2->currentwhite ^ 0x18) & pTVar6->marked) == 0) {
          return pTVar6;
        }
        pTVar6->marked = pTVar6->marked ^ 0x18;
        return pTVar6;
      }
    }
    iVar4 = (pgVar2->strt).nuse;
    if (iVar4 < iVar7) {
      ppTVar8 = ppTVar8 + (int)uVar3;
    }
    else {
      if (iVar4 == 0x7fffffff) {
        luaC_fullgc(L,1);
        if ((pgVar2->strt).nuse == 0x7fffffff) {
          luaD_throw(L,4);
        }
        iVar7 = (pgVar2->strt).size;
      }
      if (iVar7 < 0x40000000) {
        luaS_resize(L,iVar7 * 2);
        iVar7 = (pgVar2->strt).size;
      }
      ppTVar8 = (pgVar2->strt).hash + (int)(iVar7 - 1U & uVar9);
    }
    pTVar6 = (TString *)luaC_newobj(L,4,l + 0x19);
    pTVar6->hash = uVar9;
    pTVar6->extra = '\0';
    pTVar6->contents[l] = '\0';
    memcpy(pTVar6->contents,str,l);
    pTVar6->shrlen = (lu_byte)l;
    (pTVar6->u).hnext = *ppTVar8;
    *ppTVar8 = pTVar6;
    piVar1 = &(pgVar2->strt).nuse;
    *piVar1 = *piVar1 + 1;
  }
  else {
    if (0x7fffffffffffffde < l) {
      luaM_toobig(L);
    }
    uVar9 = L->l_G->seed;
    pTVar6 = (TString *)luaC_newobj(L,0x14,l + 0x19);
    pTVar6->hash = uVar9;
    pTVar6->extra = '\0';
    pTVar6->contents[l] = '\0';
    (pTVar6->u).lnglen = l;
    memcpy(pTVar6->contents,str,l);
  }
  return pTVar6;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l_unlikely(l >= (MAX_SIZE - sizeof(TString))/sizeof(char)))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getstr(ts), str, l * sizeof(char));
    return ts;
  }
}